

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit
          (BlockFormerVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  LogicOperatorType type;
  JumpConditionalStatement *this_00;
  Label local_a0;
  Label local_80;
  IRTStorage rhs;
  IRTStorage lhs;
  
  this->block_finished_ = true;
  TemplateVisitor<IRT::IRTStorage>::Accept
            (&lhs,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->left_operand_->super_BaseElement);
  TemplateVisitor<IRT::IRTStorage>::Accept
            (&rhs,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->right_operand_->super_BaseElement);
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  type = jump_conditional_statement->operator_type_;
  std::__cxx11::string::string
            ((string *)&local_80,(string *)&jump_conditional_statement->label_true_);
  std::__cxx11::string::string
            ((string *)&local_a0,(string *)&jump_conditional_statement->label_false_);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,type,lhs.expression_,rhs.expression_,&local_80,&local_a0);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(
    JumpConditionalStatement* jump_conditional_statement) {
  block_finished_ = true;

  IRTStorage lhs = Accept(jump_conditional_statement->left_operand_);
  IRTStorage rhs = Accept(jump_conditional_statement->right_operand_);

  tos_value_.statement_ = new JumpConditionalStatement(
      jump_conditional_statement->operator_type_, lhs.expression_,
      rhs.expression_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);
}